

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpBinary(Node *this,StreamWriterLE *s)

{
  BeginBinary(this,s);
  DumpPropertiesBinary(this,s);
  EndPropertiesBinary(this,s,(long)(this->properties).
                                   super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->properties).
                                   super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  DumpChildrenBinary(this,s);
  EndBinary(this,s,(bool)((this->children).
                          super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
                          _M_impl.super__Vector_impl_data._M_start !=
                          (this->children).
                          super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
                          _M_impl.super__Vector_impl_data._M_finish | this->force_has_children));
  return;
}

Assistant:

void FBX::Node::DumpBinary(Assimp::StreamWriterLE &s)
{
    // write header section (with placeholders for some things)
    BeginBinary(s);

    // write properties
    DumpPropertiesBinary(s);

    // go back and fill in property related placeholders
    EndPropertiesBinary(s, properties.size());

    // write children
    DumpChildrenBinary(s);

    // finish, filling in end offset placeholder
    EndBinary(s, force_has_children || !children.empty());
}